

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

vm_prop_id_t __thiscall CTcSymProp::gen_code_propid(CTcSymProp *this,int check_only,int is_expr)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  vm_prop_id_t vVar4;
  
  if (is_expr == 0) {
    vVar4 = (this->super_CTcSymPropBase).prop_;
  }
  else {
    if (check_only == 0) {
      CTcGenTarg::write_op(G_cg,'c');
      CTcDataStream::write_prop_id
                (&G_cs->super_CTcDataStream,(uint)(this->super_CTcSymPropBase).prop_);
      CTcGenTarg::write_op(G_cg,0x8b);
      pCVar3 = G_cg;
      iVar2 = G_cg->sp_depth_;
      iVar1 = iVar2 + 1;
      G_cg->sp_depth_ = iVar1;
      if (pCVar3->max_sp_depth_ <= iVar2) {
        pCVar3->max_sp_depth_ = iVar1;
      }
    }
    vVar4 = 0;
  }
  return vVar4;
}

Assistant:

vm_prop_id_t CTcSymProp::gen_code_propid(int check_only, int is_expr)
{
    /*
     *   If I'm to be treated as an expression (which indicates that the
     *   property symbol is explicitly enclosed in parentheses in the
     *   original source code expression), then I must evaluate this
     *   property of self.  Otherwise, I yield literally the property ID. 
     */
    if (is_expr)
    {
        /* generate code unless we're only checking */
        if (!check_only)
        {
            /* evaluate this property of self */
            G_cg->write_op(OPC_GETPROPSELF);
            G_cs->write_prop_id(get_prop());

            /* leave the result on the stack */
            G_cg->write_op(OPC_GETR0);
            G_cg->note_push();
        }

        /* tell the caller to use the stack value */
        return VM_INVALID_PROP;
    }
    else
    {
        /* simple '.prop' - return my property ID as a constant value */
        return get_prop();
    }
}